

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_getmetafield(lua_State *L,int obj,char *event)

{
  int iVar1;
  int idx;
  
  iVar1 = lua_getmetatable(L,obj);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    lua_pushstring(L,event);
    idx = -2;
    iVar1 = lua_rawget(L,-2);
    if (iVar1 == 0) {
      iVar1 = 0;
      idx = -3;
    }
    else {
      lua_rotate(L,-2,-1);
    }
    lua_settop(L,idx);
  }
  return iVar1;
}

Assistant:

LUALIB_API int luaL_getmetafield (lua_State *L, int obj, const char *event) {
  if (!lua_getmetatable(L, obj))  /* no metatable? */
    return LUA_TNIL;
  else {
    int tt;
    lua_pushstring(L, event);
    tt = lua_rawget(L, -2);
    if (tt == LUA_TNIL)  /* is metafield nil? */
      lua_pop(L, 2);  /* remove metatable and metafield */
    else
      lua_remove(L, -2);  /* remove only metatable */
    return tt;  /* return metafield type */
  }
}